

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

Task * lace_get_head(WorkerP *self)

{
  size_t sVar1;
  size_t mid;
  size_t high;
  size_t low;
  Task *dq;
  WorkerP *self_local;
  
  self_local = (WorkerP *)self->dq;
  if (((Task *)self_local)->thief != (_Worker *)0x0) {
    if (((Task *)((long)self_local + 0x40))->thief == (_Worker *)0x0) {
      self_local = (WorkerP *)((long)self_local + 0x40);
    }
    else if (((Task *)((long)self_local + 0x80))->thief == (_Worker *)0x0) {
      self_local = (WorkerP *)((long)self_local + 0x80);
    }
    else if (((Task *)((long)self_local + 0xc0))->thief == (_Worker *)0x0) {
      self_local = (WorkerP *)((long)self_local + 0xc0);
    }
    else {
      high = 2;
      sVar1 = (long)self->end - (long)self->dq >> 6;
      for (; high << 1 < sVar1; high = high << 1) {
        if (((Task *)((long)self_local + high * 2 * 0x40))->thief == (_Worker *)0x0) {
          sVar1 = high << 1;
          break;
        }
      }
      while (mid = sVar1, high < mid) {
        sVar1 = high + (mid - high >> 1);
        if (((Task *)((long)self_local + sVar1 * 0x40))->thief != (_Worker *)0x0) {
          high = sVar1 + 1;
          sVar1 = mid;
        }
      }
      self_local = (WorkerP *)((long)self_local + high * 0x40);
    }
  }
  return (Task *)self_local;
}

Assistant:

Task*
lace_get_head(WorkerP *self)
{
    Task *dq = self->dq;

    /* First check the first tasks linearly */
    if (dq[0].thief == 0) return dq;
    if (dq[1].thief == 0) return dq+1;
    if (dq[2].thief == 0) return dq+2;
    if (dq[3].thief == 0) return dq+3;

    /* Then fast search for a low/high bound using powers of 2: 4, 8, 16... */
    size_t low = 2;
    size_t high = self->end - self->dq;

    for (;;) {
        if (low*2 >= high) {
            break;
        } else if (dq[low*2].thief == 0) {
            high=low*2;
            break;
        } else {
            low*=2;
        }
    }

    /* Finally zoom in using binary search */
    while (low < high) {
        size_t mid = low + (high-low)/2;
        if (dq[mid].thief == 0) high = mid;
        else low = mid + 1;
    }

    return dq+low;
}